

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O1

void __thiscall wasm::SubTypes::~SubTypes(SubTypes *this)

{
  pointer pHVar1;
  
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->typeSubTypes)._M_h);
  pHVar1 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pHVar1 != (pointer)0x0) {
    operator_delete(pHVar1,(long)(this->types).
                                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pHVar1);
    return;
  }
  return;
}

Assistant:

SubTypes(const std::vector<HeapType>& types) : types(types) {
    for (auto type : types) {
      note(type);
    }
  }